

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::getSolution
          (MultipleShootingTranscription *this,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *states,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controls)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  undefined8 uVar5;
  Index size;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_type __new_size;
  ulong uVar11;
  long lVar12;
  pointer paVar13;
  long lVar14;
  MeshPointOrigin first;
  long local_90;
  long *local_78;
  long local_68 [2];
  long *local_58;
  long local_48 [2];
  int local_38;
  
  bVar4 = this->m_solved;
  if (bVar4 == false) {
    iDynTree::reportError
              ("MultipleShootingTranscription","getSolution",
               "First you need to solve the problem once.");
  }
  else {
    __new_size = this->m_totalMeshes - 1;
    if ((long)(states->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(states->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_start >> 5 != __new_size) {
      std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::resize
                (states,__new_size);
    }
    if ((long)(controls->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(controls->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_start >> 5 != this->m_controlMeshes) {
      std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::resize
                (controls,this->m_controlMeshes);
    }
    lVar6 = iDynTree::VectorDynSize::data();
    iDynTree::VectorDynSize::size();
    MeshPointOrigin::FirstPoint();
    paVar13 = (this->m_meshPoints).
              super__Vector_base<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (paVar13 != (this->m_meshPointsEnd)._M_current) {
      local_90 = 0;
      lVar14 = 0;
      do {
        if ((paVar13->origin).m_priority != local_38) {
          sVar7 = iDynTree::VectorDynSize::size();
          if (sVar7 != this->m_nx) {
            iDynTree::VectorDynSize::resize
                      ((ulong)((states->
                               super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar14 * 0x20));
          }
          sVar7 = paVar13->stateIndex;
          uVar8 = iDynTree::VectorDynSize::data();
          uVar9 = iDynTree::VectorDynSize::size();
          uVar10 = uVar9;
          if (((uVar8 & 7) == 0) &&
             (uVar10 = (ulong)((uint)(uVar8 >> 3) & 1), (long)uVar9 <= (long)uVar10)) {
            uVar10 = uVar9;
          }
          lVar1 = lVar6 + (ulong)(uint)sVar7 * 8;
          if (0 < (long)uVar10) {
            uVar11 = 0;
            do {
              *(undefined8 *)(uVar8 + uVar11 * 8) = *(undefined8 *)(lVar1 + uVar11 * 8);
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
          lVar12 = uVar9 - uVar10;
          uVar11 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar10;
          if (1 < lVar12) {
            do {
              puVar2 = (undefined8 *)(lVar1 + uVar10 * 8);
              uVar5 = puVar2[1];
              puVar3 = (undefined8 *)(uVar8 + uVar10 * 8);
              *puVar3 = *puVar2;
              puVar3[1] = uVar5;
              uVar10 = uVar10 + 2;
            } while ((long)uVar10 < (long)uVar11);
          }
          if ((long)uVar11 < (long)uVar9) {
            do {
              *(undefined8 *)(uVar8 + uVar11 * 8) = *(undefined8 *)(lVar1 + uVar11 * 8);
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
          }
          lVar14 = lVar14 + 1;
        }
        if (paVar13->type == Control) {
          sVar7 = iDynTree::VectorDynSize::size();
          if (sVar7 != this->m_nu) {
            iDynTree::VectorDynSize::resize
                      ((ulong)((controls->
                               super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                               )._M_impl.super__Vector_impl_data._M_start + local_90 * 0x20));
          }
          sVar7 = paVar13->controlIndex;
          uVar8 = iDynTree::VectorDynSize::data();
          uVar9 = iDynTree::VectorDynSize::size();
          uVar10 = uVar9;
          if (((uVar8 & 7) == 0) &&
             (uVar10 = (ulong)((uint)(uVar8 >> 3) & 1), (long)uVar9 <= (long)uVar10)) {
            uVar10 = uVar9;
          }
          lVar1 = lVar6 + sVar7 * 8;
          if (0 < (long)uVar10) {
            uVar11 = 0;
            do {
              *(undefined8 *)(uVar8 + uVar11 * 8) = *(undefined8 *)(lVar1 + uVar11 * 8);
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
          lVar12 = uVar9 - uVar10;
          uVar11 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar10;
          if (1 < lVar12) {
            do {
              puVar2 = (undefined8 *)(lVar1 + uVar10 * 8);
              uVar5 = puVar2[1];
              puVar3 = (undefined8 *)(uVar8 + uVar10 * 8);
              *puVar3 = *puVar2;
              puVar3[1] = uVar5;
              uVar10 = uVar10 + 2;
            } while ((long)uVar10 < (long)uVar11);
          }
          if ((long)uVar11 < (long)uVar9) {
            do {
              *(undefined8 *)(uVar8 + uVar11 * 8) = *(undefined8 *)(lVar1 + uVar11 * 8);
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
          }
          local_90 = local_90 + 1;
        }
        paVar13 = paVar13 + 1;
      } while (paVar13 != (this->m_meshPointsEnd)._M_current);
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    if (local_78 != local_68) {
      operator_delete(local_78,local_68[0] + 1);
    }
  }
  return bVar4;
}

Assistant:

bool getSolution(std::vector<VectorDynSize>& states, std::vector<VectorDynSize>& controls) {
                if (!(m_solved)){
                    reportError("MultipleShootingTranscription", "getSolution", "First you need to solve the problem once.");
                    return false;
                }

                if (states.size() != (m_totalMeshes - 1)) {
                    states.resize((m_totalMeshes - 1));
                }

                if (controls.size() != m_controlMeshes) {
                    controls.resize(m_controlMeshes);
                }

                Eigen::Map<Eigen::VectorXd> solutionMap = toEigen(m_solution);

                size_t stateIndex = 0, controlIndex = 0;

                MeshPointOrigin first = MeshPointOrigin::FirstPoint();

                for (auto mesh = m_meshPoints.begin(); mesh != m_meshPointsEnd; ++mesh){
                    if (mesh->origin != first){
                        if (states[stateIndex].size() !=  m_nx) {
                            states[stateIndex].resize(static_cast<unsigned int>(m_nx));
                        }

                        toEigen(states[stateIndex]) = solutionMap.segment(static_cast<unsigned int>(mesh->stateIndex), static_cast<unsigned int>(m_nx));
                        stateIndex++;
                    }
                    if (mesh->type == MeshPointType::Control){
                        if (controls[controlIndex].size() !=  m_nu) {
                            controls[controlIndex].resize(static_cast<unsigned int>(m_nu));
                        }

                        toEigen(controls[controlIndex]) = solutionMap.segment(static_cast<Eigen::Index>(mesh->controlIndex), static_cast<Eigen::Index>(m_nu));
                        controlIndex++;
                    }
                }

                return true;
            }